

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToType2Converter.cpp
# Opt level: O1

bool __thiscall
Type1ToType2Converter::IsOtherSubrSupported(Type1ToType2Converter *this,long inOtherSubrsIndex)

{
  if (inOtherSubrsIndex != 0) {
    if (inOtherSubrsIndex == 1) {
      this->mInFlexCollectionMode = true;
      this->mIsFirst2Coordinates = true;
    }
    else if (inOtherSubrsIndex == 3) {
      this->mHintReplacementEncountered = true;
      RecordOperatorMarker(this,0xc10);
    }
    return false;
  }
  return true;
}

Assistant:

bool Type1ToType2Converter::IsOtherSubrSupported(long inOtherSubrsIndex)
{
	// use callothersubr op code as a marker for the start of hint replacement segment
	if(3 == inOtherSubrsIndex)
	{
		mHintReplacementEncountered = true;
		RecordOperatorMarker(0x0c10);
	} 
	else if(1 == inOtherSubrsIndex)
	{
		mInFlexCollectionMode = true;
        mIsFirst2Coordinates = true;
	}
	else if(0 == inOtherSubrsIndex)
	{
		// for 0 othersubr, i need the 3rd parameter as the FD for implementing flex in type 2. so "support" it
		return true;
	}
	return false;
}